

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O0

uint GetFunctionVmReturnType
               (ExternFuncInfo *function,ExternTypeInfo *exTypes,ExternMemberInfo *exTypeExtra)

{
  uint uVar1;
  ExternTypeInfo *targetReturnType;
  uint targetReturnTypeId;
  ExternTypeInfo *targetType;
  RegVmReturnType retType;
  ExternMemberInfo *exTypeExtra_local;
  ExternTypeInfo *exTypes_local;
  ExternFuncInfo *function_local;
  
  uVar1 = exTypeExtra[exTypes[function->funcType].field_11.subType].type;
  switch(uVar1) {
  case 0:
    targetType._4_4_ = 0;
    break;
  case 1:
  case 2:
  case 3:
  case 4:
    targetType._4_4_ = 3;
    break;
  case 5:
    targetType._4_4_ = 2;
    break;
  case 6:
  case 7:
    targetType._4_4_ = 1;
    break;
  case 8:
  case 9:
    targetType._4_4_ = 3;
    break;
  case 10:
  case 0xe:
    targetType._4_4_ = 2;
    break;
  default:
    if (exTypes[uVar1].subCat == CAT_POINTER) {
      targetType._4_4_ = 2;
    }
    else if ((exTypes[uVar1].subCat == CAT_CLASS) && (exTypes[uVar1].type == TYPE_INT)) {
      targetType._4_4_ = 3;
    }
    else {
      targetType._4_4_ = 4;
    }
  }
  return targetType._4_4_;
}

Assistant:

unsigned GetFunctionVmReturnType(ExternFuncInfo &function, ExternTypeInfo *exTypes, ExternMemberInfo *exTypeExtra)
{
	RegVmReturnType retType = rvrVoid;

	ExternTypeInfo &targetType = exTypes[function.funcType];

	unsigned targetReturnTypeId = exTypeExtra[targetType.memberOffset].type;
	ExternTypeInfo &targetReturnType = exTypes[targetReturnTypeId];

	switch(targetReturnTypeId)
	{
	case NULLC_TYPE_VOID:
		retType = rvrVoid;
		break;
	case NULLC_TYPE_BOOL:
	case NULLC_TYPE_CHAR:
	case NULLC_TYPE_SHORT:
	case NULLC_TYPE_INT:
		retType = rvrInt;
		break;
	case NULLC_TYPE_LONG:
		retType = rvrLong;
		break;
	case NULLC_TYPE_FLOAT:
	case NULLC_TYPE_DOUBLE:
		retType = rvrDouble;
		break;
	case NULLC_TYPE_TYPEID:
	case NULLC_TYPE_FUNCTION:
		retType = rvrInt;
		break;
	case NULLC_TYPE_NULLPTR:
	case NULLC_TYPE_VOID_REF:
		retType = NULLC_PTR_SIZE == 4 ? rvrInt : rvrLong;
		break;
	default:
		if(targetReturnType.subCat == ExternTypeInfo::CAT_POINTER)
			retType = NULLC_PTR_SIZE == 4 ? rvrInt : rvrLong;
		else if(targetReturnType.subCat == ExternTypeInfo::CAT_CLASS && targetReturnType.type == ExternTypeInfo::TYPE_INT)
			retType = rvrInt;
		else
			retType = rvrStruct;
		break;
	}

	return retType;
}